

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O1

int get_gf_active_quality(PRIMARY_RATE_CONTROL *p_rc,int q,aom_bit_depth_t bit_depth)

{
  int iVar1;
  undefined *puVar2;
  uint uVar3;
  undefined *puVar4;
  
  uVar3 = bit_depth - AOM_BITS_8;
  if (uVar3 < 5) {
    puVar2 = (&PTR_arfgf_low_motion_minq_8_005d5a18)[uVar3];
  }
  else {
    puVar2 = (undefined *)0x0;
  }
  iVar1 = p_rc->gfu_boost;
  if (uVar3 < 5) {
    puVar4 = (&PTR_arfgf_high_motion_minq_8_005d5a40)[uVar3];
  }
  else {
    puVar4 = (undefined *)0x0;
  }
  if (0x960 < iVar1) {
    return *(int *)(puVar2 + (long)q * 4);
  }
  if (iVar1 < 300) {
    return *(int *)(puVar4 + (long)q * 4);
  }
  return ((*(int *)(puVar4 + (long)q * 4) - *(int *)(puVar2 + (long)q * 4)) * (0x960 - iVar1) +
         0x41a) / 0x834 + *(int *)(puVar2 + (long)q * 4);
}

Assistant:

static int get_gf_active_quality(const PRIMARY_RATE_CONTROL *const p_rc, int q,
                                 aom_bit_depth_t bit_depth) {
  return get_gf_active_quality_no_rc(p_rc->gfu_boost, q, bit_depth);
}